

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O0

void __thiscall
shift_window_transformer::WindowAttention<float>::forward
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  pointer *ppfVar1;
  float fVar2;
  value_type vVar3;
  value_type vVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Tensor<float> *pTVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  pointer this_00;
  const_iterator __first;
  const_iterator __last;
  reference pvVar14;
  size_type sVar15;
  ulong uVar16;
  reference pvVar17;
  size_type sVar18;
  iterator __first_00;
  iterator __last_00;
  vector<int,std::allocator<int>> *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_390;
  const_iterator local_388;
  float *local_380;
  float *local_378;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_370;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_368;
  const_iterator local_360;
  undefined1 local_358 [8];
  Tensor<float> tmp4;
  int new_pos;
  int h;
  int mw_h;
  int mw_w;
  int w_h;
  int w_w;
  int d;
  int i_2;
  Tensor<float> tmp3;
  value_type_conflict2 local_2d0;
  int pk_3;
  float val_1;
  int pj_3;
  int pi_3;
  int pos_4;
  Tensor<float> tmp2;
  Tensor<float> attn;
  int local_258;
  int pk_2;
  int pj_2;
  int pi_2;
  int pk_1;
  int pj_1;
  int pi_1;
  int pos_3;
  int batch;
  int j_1;
  int i_1;
  int pos_2;
  int j;
  int i;
  int pos_1;
  int pk;
  float val;
  int pj;
  int pi;
  int pos;
  int matY;
  int matX;
  Tensor<float> dots;
  int nw_w;
  int nw_h;
  Tensor<float> v;
  Tensor<float> k;
  Tensor<float> q;
  Tensor<float> vTmp;
  Tensor<float> kTmp;
  Tensor<float> qTmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  const_iterator local_90;
  float *local_88;
  float *local_80;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_70;
  const_iterator local_68;
  undefined1 local_50 [8];
  Tensor<float> tmp;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  WindowAttention<float> *this_local;
  
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)output;
  Tensor<float>::Tensor((Tensor<float> *)local_50);
  if ((this->shifted & 1U) == 0) {
    local_70._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::end
                            ((vector<float,_std::allocator<float>_> *)local_50);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)&local_68
               ,&local_70);
    local_78._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            (&input->super_vector<float,_std::allocator<float>_>);
    local_80 = (float *)std::vector<float,_std::allocator<float>_>::end
                                  (&input->super_vector<float,_std::allocator<float>_>);
    local_88 = (float *)std::vector<float,std::allocator<float>>::
                        insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                                  ((vector<float,std::allocator<float>> *)local_50,local_68,local_78
                                   ,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                     )local_80);
    ppfVar1 = &tmp.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    local_98._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)ppfVar1);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_90,
               &local_98);
    __first = std::vector<int,_std::allocator<int>_>::begin(&input->shape);
    __last = std::vector<int,_std::allocator<int>_>::end(&input->shape);
    qTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::vector<int,std::allocator<int>>::
                  insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                            ((vector<int,std::allocator<int>> *)ppfVar1,local_90,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              )__first._M_current,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              )__last._M_current);
  }
  else {
    (*(code *)**(undefined8 **)this->cyclicShift)(this->cyclicShift,input,local_50);
  }
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  (**(this->qLinear->super_Layer<float>)._vptr_Layer)
            (this->qLinear,local_50,
             &kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)
            (this->kLinear,local_50,
             &vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)
            (this->kLinear,local_50,
             &q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::Tensor((Tensor<float> *)&nw_w);
  ppfVar1 = &qTmp.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)ppfVar1,0);
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = *pvVar14 / this->windowSize;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)ppfVar1,1);
  dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = *pvVar14 / this->windowSize;
  reArrange(this,(Tensor<float> *)
                 &kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
            (Tensor<float> *)
            &k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  reArrange(this,(Tensor<float> *)
                 &vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
            (Tensor<float> *)
            &v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  reArrange(this,(Tensor<float> *)
                 &q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Tensor<float> *)&nw_w);
  Tensor<float>::Tensor((Tensor<float> *)&matY);
  ppfVar1 = &q.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  sVar15 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)ppfVar1);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)ppfVar1,sVar15 - 2);
  pos = *pvVar14;
  sVar15 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)ppfVar1);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)ppfVar1,sVar15 - 1);
  pi = *pvVar14;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &dots.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<int,_std::allocator<int>_> *)ppfVar1);
  sVar15 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)
                      &dots.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &dots.super_vector<float,_std::allocator<float>_>.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,sVar15 - 2);
  vVar4 = *pvVar14;
  sVar15 = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)
                      &dots.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &dots.super_vector<float,_std::allocator<float>_>.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,sVar15 - 1);
  *pvVar14 = vVar4;
  for (pj = 0; uVar16 = (ulong)pj,
      sVar15 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage), uVar16 < sVar15;
      pj = pos * pi + pj) {
    for (val = 0.0; (int)val < pos; val = (float)((int)val + 1)) {
      for (pk = 0; pk < pos; pk = pk + 1) {
        pos_1 = 0;
        for (i = 0; i < pi; i = i + 1) {
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)
                               &k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                               (long)(pj + (int)val * pi + i));
          fVar2 = *pvVar17;
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)
                               &v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(pj + pk * pi + i));
          pos_1 = (int)(fVar2 * *pvVar17 + (float)pos_1);
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&matY,(value_type_conflict2 *)&pos_1);
      }
    }
  }
  if ((this->relativePosEmbedding & 1U) == 0) {
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       (&this->posEmbedding->super_vector<float,_std::allocator<float>_>);
    if (sVar15 != (long)(pos * pos)) {
      __assert_fail("posEmbedding->size() == matX * matX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x8b,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    for (j_1 = 0; sVar15 = std::vector<float,_std::allocator<float>_>::size
                                     ((vector<float,_std::allocator<float>_> *)&matY),
        (ulong)(long)j_1 < sVar15; j_1 = pos * pos + j_1) {
      for (batch = 0; batch < pos; batch = batch + 1) {
        for (pos_3 = 0; pos_3 < pos; pos_3 = pos_3 + 1) {
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&this->posEmbedding->super_vector<float,_std::allocator<float>_>,
                               (long)(batch * pos + pos_3));
          fVar2 = *pvVar17;
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)&matY,
                               (long)(j_1 + batch * pos + pos_3));
          *pvVar17 = fVar2 + *pvVar17;
        }
      }
    }
  }
  else {
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       (&this->posEmbedding->super_vector<float,_std::allocator<float>_>);
    if (sVar15 != (long)((this->windowSize * 2 + -1) * (this->windowSize * 2 + -1))) {
      __assert_fail("posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x80,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    for (j = 0; sVar15 = std::vector<float,_std::allocator<float>_>::size
                                   ((vector<float,_std::allocator<float>_> *)&matY),
        (ulong)(long)j < sVar15; j = pos * pos + j) {
      for (pos_2 = 0; pos_2 < pos; pos_2 = pos_2 + 1) {
        for (i_1 = 0; i_1 < pos; i_1 = i_1 + 1) {
          pTVar8 = this->posEmbedding;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->relativeIndices->super_vector<int,_std::allocator<int>_>,
                               (long)(pos_2 * pos * 2 + i_1 * 2));
          iVar5 = *pvVar14;
          iVar6 = this->windowSize;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->relativeIndices->super_vector<int,_std::allocator<int>_>,
                               (long)(pos_2 * pos * 2 + i_1 * 2 + 1));
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&pTVar8->super_vector<float,_std::allocator<float>_>,
                               (long)(iVar5 * (iVar6 * 2 + -1) + *pvVar14));
          fVar2 = *pvVar17;
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)&matY,
                               (long)(j + pos_2 * pos + i_1));
          *pvVar17 = fVar2 + *pvVar17;
        }
      }
    }
  }
  if ((this->shifted & 1U) != 0) {
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)&matY);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &dots.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    iVar5 = *pvVar14;
    for (pj_1 = 0;
        sVar18 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&matY),
        (ulong)(long)pj_1 < sVar18; pj_1 = (int)(sVar15 / (ulong)(long)iVar5) + pj_1) {
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &dots.super_vector<float,_std::allocator<float>_>.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,1);
      for (pk_1 = *pvVar14 -
                  (int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &dots.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,1), pk_1 < *pvVar14;
          pk_1 = pk_1 + 1) {
        for (pi_2 = 0;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2), pi_2 < *pvVar14;
            pi_2 = pi_2 + 1) {
          for (pj_2 = 0;
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &dots.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,3), pj_2 < *pvVar14;
              pj_2 = pj_2 + 1) {
            pTVar8 = this->upperLowerMask;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&pTVar8->super_vector<float,_std::allocator<float>_>,
                                 (long)(pi_2 * *pvVar14 + pj_2));
            fVar2 = *pvVar17;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2);
            iVar6 = *pvVar14;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            iVar7 = *pvVar14;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&matY,
                                 (long)(pj_1 + pk_1 * iVar6 * iVar7 + pi_2 * *pvVar14 + pj_2));
            *pvVar17 = fVar2 + *pvVar17;
          }
        }
      }
      for (pk_2 = (int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + -1;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &dots.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,1), pk_2 < *pvVar14;
          pk_2 = (int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + pk_2) {
        for (local_258 = 0;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2), local_258 < *pvVar14
            ; local_258 = local_258 + 1) {
          for (attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &dots.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,3),
              attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ < *pvVar14;
              attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   attn.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
            pTVar8 = this->leftRightMask;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&pTVar8->super_vector<float,_std::allocator<float>_>,
                                 (long)(local_258 * *pvVar14 +
                                       attn.shape.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
            fVar2 = *pvVar17;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2);
            iVar6 = *pvVar14;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            iVar7 = *pvVar14;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3);
            pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&matY,
                                 (long)(pj_1 + pk_2 * iVar6 * iVar7 + local_258 * *pvVar14 +
                                       attn.shape.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
            *pvVar17 = fVar2 + *pvVar17;
          }
        }
      }
    }
  }
  Tensor<float>::Tensor
            ((Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SoftMax<float>::forward
            (&this->softMax,(Tensor<float> *)&matY,
             (Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::Tensor((Tensor<float> *)&pi_3);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &tmp2.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &v.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  pj_3 = 0;
  while( true ) {
    iVar6 = pj_3;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &dots.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    iVar5 = *pvVar14;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &dots.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,1);
    if (iVar5 * *pvVar14 <= iVar6) break;
    for (val_1 = 0.0; fVar2 = val_1,
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &dots.super_vector<float,_std::allocator<float>_>.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,2), (int)fVar2 < *pvVar14;
        val_1 = (float)((int)val_1 + 1)) {
      for (pk_3 = 0; iVar5 = pk_3,
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &v.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,3), iVar5 < *pvVar14;
          pk_3 = pk_3 + 1) {
        local_2d0 = 0.0;
        for (tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            iVar5 = tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &dots.super_vector<float,_std::allocator<float>_>.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,3), iVar6 = pj_3,
            iVar5 < *pvVar14;
            tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ =
                 tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &dots.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,2);
          iVar5 = *pvVar14;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &dots.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,3);
          fVar2 = val_1;
          iVar7 = *pvVar14;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &dots.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,3);
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)&matY,
                               (long)(iVar6 * iVar5 * iVar7 + (int)fVar2 * *pvVar14 +
                                     tmp3.shape.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          iVar13 = pj_3;
          fVar2 = *pvVar17;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &v.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,2);
          iVar5 = *pvVar14;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &v.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,3);
          iVar7 = tmp3.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
          iVar6 = *pvVar14;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &v.super_vector<float,_std::allocator<float>_>.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,3);
          pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)&nw_w,
                               (long)(iVar13 * iVar5 * iVar6 + iVar7 * *pvVar14 + pk_3));
          local_2d0 = fVar2 * *pvVar17 + local_2d0;
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&pi_3,&local_2d0);
      }
    }
    pj_3 = pj_3 + 1;
  }
  Tensor<float>::Tensor((Tensor<float> *)&d);
  sVar15 = std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)&pi_3);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)&d,sVar15);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &tmp3.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &qTmp.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  for (w_w = 0; sVar15 = std::vector<float,_std::allocator<float>_>::size
                                   ((vector<float,_std::allocator<float>_> *)&pi_3),
      (ulong)(long)w_w < sVar15; w_w = w_w + 1) {
    uVar16 = (long)w_w / (long)this->headDim;
    uVar9 = (long)w_w / (long)this->headDim;
    uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
            (long)this->windowSize;
    uVar10 = (long)w_w / (long)this->headDim;
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
             (long)this->windowSize;
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
             (long)this->windowSize;
    uVar11 = (long)w_w / (long)this->headDim;
    uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
             (long)this->windowSize;
    uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
             (long)this->windowSize;
    uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
             (long)(int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    uVar12 = (long)w_w / (long)this->headDim;
    uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
             (long)this->windowSize;
    uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
             (long)this->windowSize;
    uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
             (long)(int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
              (long)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
    tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         w_w % this->headDim +
         tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ * this->headDim +
         (int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) %
              (long)this->windowSize) * this->headDim * this->heads +
         (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
              (long)this->windowSize) * this->windowSize * this->headDim * this->heads +
         (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
              (long)(int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage) * this->windowSize *
         this->windowSize * this->headDim * this->heads +
         (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
              (long)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_) *
         (int)dots.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage * this->windowSize * this->windowSize *
         this->headDim * this->heads;
    pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&pi_3,(long)w_w);
    vVar3 = *pvVar17;
    pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&d,
                         (long)(int)tmp4.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage);
    *pvVar17 = vVar3;
  }
  Tensor<float>::Tensor((Tensor<float> *)local_358);
  (**(this->outLinear->super_Layer<float>)._vptr_Layer)(this->outLinear,&d,local_358);
  if ((this->shifted & 1U) == 0) {
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)
               tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)
               (tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 6));
    this_00 = tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_368._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::end
                            ((vector<float,_std::allocator<float>_> *)
                             tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
               &local_360,&local_368);
    local_370._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)local_358);
    local_378 = (float *)std::vector<float,_std::allocator<float>_>::end
                                   ((vector<float,_std::allocator<float>_> *)local_358);
    local_380 = (float *)std::vector<float,std::allocator<float>>::
                         insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
                                   ((vector<float,std::allocator<float>> *)this_00,local_360,
                                    local_370,
                                    (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                     )local_378);
    this_01 = (vector<int,std::allocator<int>> *)
              (tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 6);
    local_390._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)this_01);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_388,
               &local_390);
    ppfVar1 = &tmp4.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    __first_00 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)ppfVar1);
    __last_00 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)ppfVar1);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (this_01,local_388,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first_00._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __last_00._M_current);
  }
  else {
    (*(code *)**(undefined8 **)this->cyclicBackShift)
              (this->cyclicBackShift,local_358,
               tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  Tensor<float>::~Tensor((Tensor<float> *)local_358);
  Tensor<float>::~Tensor((Tensor<float> *)&d);
  Tensor<float>::~Tensor((Tensor<float> *)&pi_3);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &tmp2.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor((Tensor<float> *)&matY);
  Tensor<float>::~Tensor((Tensor<float> *)&nw_w);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &v.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &k.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &q.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &vTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor
            ((Tensor<float> *)
             &kTmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Tensor<float>::~Tensor((Tensor<float> *)local_50);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            if (shifted) {
                cyclicShift->forward(input, tmp);
            } else {
                tmp.insert(tmp.end(), input.begin(), input.end());
                tmp.shape.insert(tmp.shape.end(), input.shape.begin(), input.shape.end());
            }
            Tensor<T> qTmp{};
            Tensor<T> kTmp{};
            Tensor<T> vTmp{};
            qLinear->forward(tmp, qTmp);
            kLinear->forward(tmp, kTmp);
            kLinear->forward(tmp, vTmp);
            Tensor<T> q{}, k{}, v{};
            int nw_h = qTmp.shape[0] / windowSize, nw_w = qTmp.shape[1] / windowSize;
            reArrange(qTmp, q);
            reArrange(kTmp, k);
            reArrange(vTmp, v);
            Tensor<T> dots{};
            int matX = q.shape[q.shape.size() - 2];
            int matY = q.shape[q.shape.size() - 1];
            dots.shape = q.shape;
            dots.shape[dots.shape.size() - 1] = dots.shape[dots.shape.size() - 2];
            for (int pos = 0; pos < q.size(); pos += matX * matY) {
                for (int pi = 0; pi < matX; ++pi) {
                    for (int pj = 0; pj < matX; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < matY; ++pk) {
                            val += q[pos + pi * matY + pk] * k[pos + pj * matY + pk];
                        }
                        dots.push_back(val);
                    }
                }
            }

            if (relativePosEmbedding) {
                assert(posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1));
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[
                                    (*relativeIndices)[i * matX * 2 + j * 2] * (2 * windowSize - 1) +
                                    (*relativeIndices)[i * matX * 2 + j * 2 + 1]];
                        }
                    }
                }
            } else {
                assert(posEmbedding->size() == matX * matX);
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[i * matX + j];
                        }
                    }
                }
            }

            if (shifted) {
                int batch = dots.size() / dots.shape[0];
                for (int pos = 0; pos < dots.size(); pos += batch) {
                    for (int pi = dots.shape[1] - nw_w; pi < dots.shape[1]; ++pi) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*upperLowerMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                    for (int pi = nw_w - 1; pi < dots.shape[1]; pi += nw_w) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*leftRightMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                }
            }
            Tensor<T> attn{};
            softMax.forward(dots, attn);
            Tensor<T> tmp2{};
            tmp2.shape = v.shape;
            for (int pos = 0; pos < dots.shape[0] * dots.shape[1]; ++pos) {
                for (int pi = 0; pi < dots.shape[2]; ++pi) {
                    for (int pj = 0; pj < v.shape[3]; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < dots.shape[3]; ++pk) {
                            val += dots[pos * dots.shape[2] * dots.shape[3] + pi * dots.shape[3] + pk] *
                                   v[pos * v.shape[2] * v.shape[3] + pk * v.shape[3] + pj];
                        }
                        tmp2.push_back(val);
                    }
                }
            }
            Tensor<T> tmp3{};
            tmp3.resize(tmp2.size());
            tmp3.shape = qTmp.shape;
            for (int i = 0; i < tmp2.size(); ++i) {
                int d = i % headDim;
                int w_w = i / headDim % windowSize;
                int w_h = i / headDim / windowSize % windowSize;
                int mw_w = i / headDim / windowSize / windowSize % nw_w;
                int mw_h = i / headDim / windowSize / windowSize / nw_w % nw_h;
                int h = i / headDim / windowSize / windowSize / nw_w / nw_h;
                int new_pos = d + h * headDim +
                              w_w * headDim * heads +
                              w_h * windowSize * headDim * heads +
                              mw_w * windowSize * windowSize * headDim * heads +
                              mw_h * nw_w * windowSize * windowSize * headDim * heads;
                tmp3[new_pos] = tmp2[i];
            }
            Tensor<T> tmp4{};
            outLinear->forward(tmp3, tmp4);

            if (shifted) {
                cyclicBackShift->forward(tmp4, output);
            } else {
                output.clear();
                output.shape.clear();
                output.insert(output.end(), tmp4.begin(), tmp4.end());
                output.shape.insert(output.shape.end(), tmp4.shape.begin(), tmp4.shape.end());
            }
        }